

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O0

void __thiscall
fizplex::Simplex::exchange_base_column(Simplex *this,Candidate candidate,RatioTestResult rt)

{
  bool bVar1;
  double *pdVar2;
  Debug *this_00;
  reference __a;
  reference __b;
  long in_RDI;
  size_type in_stack_00000028;
  double in_stack_00000038;
  size_t candidate_non_basic_index;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff68;
  Debug *in_stack_ffffffffffffff70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  Debug local_50;
  unsigned_long *local_40;
  unsigned_long *local_38;
  size_type local_30;
  unsigned_long *local_28;
  unsigned_long *local_20;
  unsigned_long *local_18;
  unsigned_long *local_10;
  
  __first._M_current = (unsigned_long *)&stack0x00000020;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10),
             in_stack_00000028);
  pdVar2 = DVector::operator[]((DVector *)in_stack_ffffffffffffff80._M_current,
                               (size_t)in_stack_ffffffffffffff78._M_current);
  *pdVar2 = in_stack_00000038;
  local_18 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (in_stack_ffffffffffffff68);
  local_20 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (in_stack_ffffffffffffff68);
  local_10 = (unsigned_long *)
             std::
             find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       (__first,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78._M_current);
  local_28 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (in_stack_ffffffffffffff68);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_ffffffffffffff70,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_ffffffffffffff68);
  if (!bVar1) {
    __assert_fail("it != non_basic_indices.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex.cc"
                  ,0xa5,"void fizplex::Simplex::exchange_base_column(Candidate, RatioTestResult)");
  }
  local_38 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (in_stack_ffffffffffffff68);
  local_40 = local_10;
  local_30 = std::
             distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Debug::Debug(&local_50,1,(ostream *)&std::cerr);
  this_00 = Debug::operator<<(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10),
             __first._M_current[1]);
  Debug::operator<<(this_00,(unsigned_long)in_stack_ffffffffffffff68);
  Debug::operator<<(this_00,(char *)in_stack_ffffffffffffff68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x28),local_30);
  Debug::operator<<(this_00,(unsigned_long)in_stack_ffffffffffffff68);
  Debug::operator<<(this_00,(char *)in_stack_ffffffffffffff68);
  __a = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x28),local_30
                  );
  __b = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10),
                   __first._M_current[1]);
  std::swap<unsigned_long>(__a,__b);
  return;
}

Assistant:

void Simplex::exchange_base_column(Candidate candidate, RatioTestResult rt) {
  x[basic_indices[rt.leaving_index]] = rt.leaving_bound;
  const auto it = std::find(non_basic_indices.begin(), non_basic_indices.end(),
                            candidate.index);

  assert(it != non_basic_indices.end());
  const size_t candidate_non_basic_index =
      std::distance(non_basic_indices.begin(), it);

  Debug(1) << "Leaving: " << basic_indices[rt.leaving_index]
           << ", Entering: " << non_basic_indices[candidate_non_basic_index]
           << "\n";
  std::swap<size_t>(non_basic_indices[candidate_non_basic_index],
                    basic_indices[rt.leaving_index]);
}